

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O0

void Ssw_ManPrintStats(Ssw_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  int local_144;
  int local_124;
  double local_110;
  double local_100;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  int local_6c;
  int local_50;
  double nMemory;
  Ssw_Man_t *p_local;
  
  iVar2 = Aig_ManObjNumMax(p->pAig);
  iVar1 = p->nFrames;
  uVar4 = p->pPars->nFramesK;
  uVar5 = p->pPars->nFramesAddSim;
  uVar6 = p->pPars->nBTLimit;
  uVar3 = Saig_ManConstrNum(p->pAig);
  Abc_Print(1,
            "Parameters: F = %d. AddF = %d. C-lim = %d. Constr = %d. MaxLev = %d. Mem = %0.2f MB.\n"
            ,((double)iVar2 * 1.0 * (double)iVar1 * 24.0) / 1048576.0,(ulong)uVar4,(ulong)uVar5,
            (ulong)uVar6,(ulong)uVar3,p->pPars->nMaxLevs);
  uVar4 = Saig_ManPiNum(p->pAig);
  uVar5 = Saig_ManPoNum(p->pAig);
  uVar6 = Saig_ManRegNum(p->pAig);
  uVar3 = Aig_ManNodeNum(p->pAig);
  uVar7 = (undefined4)(0 / (long)(p->pPars->nIters + 1));
  Abc_Print(1,"AIG       : PI = %d. PO = %d. Latch = %d. Node = %d.  Ave SAT vars = %d.\n",
            (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar3,uVar7);
  uVar4 = p->nSatProof;
  uVar5 = p->nSatCallsSat;
  uVar6 = p->nSatFailsReal;
  uVar3 = Ssw_ManCountEquivs(p);
  Abc_Print(1,"SAT calls : Proof = %d. Cex = %d. Fail = %d. Lits proved = %d.\n",(ulong)uVar4,
            (ulong)uVar5,(ulong)uVar6,(ulong)uVar3);
  Abc_Print(1,"SAT solver: Vars max = %d. Calls max = %d. Recycles = %d. Sim rounds = %d.\n",
            (ulong)(uint)p->nVarsMax,(ulong)(uint)p->nCallsMax,(ulong)(uint)p->nRecyclesTotal,
            (ulong)(uint)p->nSimRounds);
  if (p->nNodesBeg == 0) {
    local_50 = 1;
  }
  else {
    local_50 = p->nNodesBeg;
  }
  if (p->nRegsBeg == 0) {
    local_6c = 1;
  }
  else {
    local_6c = p->nRegsBeg;
  }
  Abc_Print(1,"NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
            ,((double)(p->nNodesBeg - p->nNodesEnd) * 100.0) / (double)local_50,
            ((double)(p->nRegsBeg - p->nRegsEnd) * 100.0) / (double)local_6c,
            (ulong)(uint)p->nNodesBeg,(ulong)(uint)p->nNodesEnd,(ulong)(uint)p->nRegsBeg,
            (ulong)(uint)p->nRegsEnd,uVar7);
  p->timeOther = ((((p->timeTotal - p->timeBmc) - p->timeReduce) - p->timeMarkCones) - p->timeSimSat
                 ) - p->timeSat;
  Abc_Print(1,"%s =","BMC        ");
  if (p->timeTotal == 0) {
    local_80 = 0.0;
  }
  else {
    local_80 = ((double)p->timeBmc * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeBmc * 1.0) / 1000000.0,local_80);
  Abc_Print(1,"%s =","Spec reduce");
  if (p->timeTotal == 0) {
    local_90 = 0.0;
  }
  else {
    local_90 = ((double)p->timeReduce * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeReduce * 1.0) / 1000000.0,local_90);
  Abc_Print(1,"%s =","Mark cones ");
  if (p->timeTotal == 0) {
    local_a0 = 0.0;
  }
  else {
    local_a0 = ((double)p->timeMarkCones * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeMarkCones * 1.0) / 1000000.0,local_a0);
  Abc_Print(1,"%s =","Sim SAT    ");
  if (p->timeTotal == 0) {
    local_b0 = 0.0;
  }
  else {
    local_b0 = ((double)p->timeSimSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSimSat * 1.0) / 1000000.0,local_b0);
  Abc_Print(1,"%s =","SAT solving");
  if (p->timeTotal == 0) {
    local_c0 = 0.0;
  }
  else {
    local_c0 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSat * 1.0) / 1000000.0,local_c0);
  Abc_Print(1,"%s =","  unsat    ");
  if (p->timeTotal == 0) {
    local_d0 = 0.0;
  }
  else {
    local_d0 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUnsat * 1.0) / 1000000.0,local_d0);
  Abc_Print(1,"%s =","  sat      ");
  if (p->timeTotal == 0) {
    local_e0 = 0.0;
  }
  else {
    local_e0 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatSat * 1.0) / 1000000.0,local_e0);
  Abc_Print(1,"%s =","  undecided");
  if (p->timeTotal == 0) {
    local_f0 = 0.0;
  }
  else {
    local_f0 = ((double)p->timeSatUndec * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUndec * 1.0) / 1000000.0,local_f0);
  Abc_Print(1,"%s =","Other      ");
  if (p->timeTotal == 0) {
    local_100 = 0.0;
  }
  else {
    local_100 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_100);
  Abc_Print(1,"%s =","TOTAL      ");
  if (p->timeTotal == 0) {
    local_110 = 0.0;
  }
  else {
    local_110 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_110);
  if (p->pAig->nConstrs != 0) {
    Abc_Print(1,"Statistics reflecting the use of constraints:\n");
    Abc_Print(1,"Total cones  = %6d.  Constraint cones = %6d. (%6.2f %%)\n",
              ((double)p->nConesConstr * 100.0) / (double)p->nConesTotal,(ulong)(uint)p->nConesTotal
              ,(ulong)(uint)p->nConesConstr);
    Abc_Print(1,"Total equivs = %6d.  Removed equivs   = %6d. (%6.2f %%)\n",
              ((double)p->nEquivsConstr * 100.0) / (double)p->nEquivsTotal,
              (ulong)(uint)p->nEquivsTotal,(ulong)(uint)p->nEquivsConstr);
    if (p->nNodesBegC == 0) {
      local_124 = 1;
    }
    else {
      local_124 = p->nNodesBegC;
    }
    if (p->nRegsBegC == 0) {
      local_144 = 1;
    }
    else {
      local_144 = p->nRegsBegC;
    }
    Abc_Print(1,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(p->nNodesBegC - p->nNodesEndC) * 100.0) / (double)local_124,
              ((double)(p->nRegsBegC - p->nRegsEndC) * 100.0) / (double)local_144,
              (ulong)(uint)p->nNodesBegC,(ulong)(uint)p->nNodesEndC,(ulong)(uint)p->nRegsBegC,
              (ulong)(uint)p->nRegsEndC);
  }
  return;
}

Assistant:

void Ssw_ManPrintStats( Ssw_Man_t * p )
{
    double nMemory = 1.0*Aig_ManObjNumMax(p->pAig)*p->nFrames*(2*sizeof(int)+2*sizeof(void*))/(1<<20);

    Abc_Print( 1, "Parameters: F = %d. AddF = %d. C-lim = %d. Constr = %d. MaxLev = %d. Mem = %0.2f MB.\n",
        p->pPars->nFramesK, p->pPars->nFramesAddSim, p->pPars->nBTLimit, Saig_ManConstrNum(p->pAig), p->pPars->nMaxLevs, nMemory );
    Abc_Print( 1, "AIG       : PI = %d. PO = %d. Latch = %d. Node = %d.  Ave SAT vars = %d.\n",
        Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), Saig_ManRegNum(p->pAig), Aig_ManNodeNum(p->pAig),
        0/(p->pPars->nIters+1) );
    Abc_Print( 1, "SAT calls : Proof = %d. Cex = %d. Fail = %d. Lits proved = %d.\n",
        p->nSatProof, p->nSatCallsSat, p->nSatFailsReal, Ssw_ManCountEquivs(p) );
    Abc_Print( 1, "SAT solver: Vars max = %d. Calls max = %d. Recycles = %d. Sim rounds = %d.\n",
        p->nVarsMax, p->nCallsMax, p->nRecyclesTotal, p->nSimRounds );
    Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
        p->nNodesBeg, p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/(p->nNodesBeg?p->nNodesBeg:1),
        p->nRegsBeg, p->nRegsEnd, 100.0*(p->nRegsBeg-p->nRegsEnd)/(p->nRegsBeg?p->nRegsBeg:1) );

    p->timeOther = p->timeTotal-p->timeBmc-p->timeReduce-p->timeMarkCones-p->timeSimSat-p->timeSat;
    ABC_PRTP( "BMC        ", p->timeBmc,       p->timeTotal );
    ABC_PRTP( "Spec reduce", p->timeReduce,    p->timeTotal );
    ABC_PRTP( "Mark cones ", p->timeMarkCones, p->timeTotal );
    ABC_PRTP( "Sim SAT    ", p->timeSimSat,    p->timeTotal );
    ABC_PRTP( "SAT solving", p->timeSat,       p->timeTotal );
    ABC_PRTP( "  unsat    ", p->timeSatUnsat,  p->timeTotal );
    ABC_PRTP( "  sat      ", p->timeSatSat,    p->timeTotal );
    ABC_PRTP( "  undecided", p->timeSatUndec,  p->timeTotal );
    ABC_PRTP( "Other      ", p->timeOther,     p->timeTotal );
    ABC_PRTP( "TOTAL      ", p->timeTotal,     p->timeTotal );

    // report the reductions
    if ( p->pAig->nConstrs )
    {
        Abc_Print( 1, "Statistics reflecting the use of constraints:\n" );
        Abc_Print( 1, "Total cones  = %6d.  Constraint cones = %6d. (%6.2f %%)\n",
            p->nConesTotal, p->nConesConstr, 100.0*p->nConesConstr/p->nConesTotal );
        Abc_Print( 1, "Total equivs = %6d.  Removed equivs   = %6d. (%6.2f %%)\n",
            p->nEquivsTotal, p->nEquivsConstr, 100.0*p->nEquivsConstr/p->nEquivsTotal );
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
            p->nNodesBegC, p->nNodesEndC, 100.0*(p->nNodesBegC-p->nNodesEndC)/(p->nNodesBegC?p->nNodesBegC:1),
            p->nRegsBegC, p->nRegsEndC,   100.0*(p->nRegsBegC-p->nRegsEndC)/(p->nRegsBegC?p->nRegsBegC:1) );
    }
}